

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionSystemBullet::RayHit
          (ChCollisionSystemBullet *this,ChVector<double> *from,ChVector<double> *to,
          ChRayhitResult *result,short filter_group,short filter_mask)

{
  ClosestRayResultCallback rayCallback;
  cbtVector3 btto;
  cbtVector3 btfrom;
  
  (*this->bt_collision_world->_vptr_cbtCollisionWorld[8])();
  result->hit = false;
  return false;
}

Assistant:

bool ChCollisionSystemBullet::RayHit(const ChVector<>& from,
                                     const ChVector<>& to,
                                     ChRayhitResult& result,
                                     short int filter_group,
                                     short int filter_mask) const {
    cbtVector3 btfrom((cbtScalar)from.x(), (cbtScalar)from.y(), (cbtScalar)from.z());
    cbtVector3 btto((cbtScalar)to.x(), (cbtScalar)to.y(), (cbtScalar)to.z());

    cbtCollisionWorld::ClosestRayResultCallback rayCallback(btfrom, btto);
    rayCallback.m_collisionFilterGroup = filter_group;
    rayCallback.m_collisionFilterMask = filter_mask;

    this->bt_collision_world->rayTest(btfrom, btto, rayCallback);

    if (rayCallback.hasHit()) {
        result.hitModel = (ChCollisionModel*)(rayCallback.m_collisionObject->getUserPointer());
        if (result.hitModel) {
            result.hit = true;
            result.abs_hitPoint.Set(rayCallback.m_hitPointWorld.x(), rayCallback.m_hitPointWorld.y(),
                                    rayCallback.m_hitPointWorld.z());
            result.abs_hitNormal.Set(rayCallback.m_hitNormalWorld.x(), rayCallback.m_hitNormalWorld.y(),
                                     rayCallback.m_hitNormalWorld.z());
            result.abs_hitNormal.Normalize();
            result.dist_factor = rayCallback.m_closestHitFraction;
            result.abs_hitPoint = result.abs_hitPoint - result.abs_hitNormal * result.hitModel->GetEnvelope();
            return true;
        }
    }
    result.hit = false;
    return false;
}